

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b_rle.h
# Opt level: O1

int32_t FastPForLib::Simple8b_Codec::Compress
                  (uint32_t *input,int32_t inOffset,uint32_t inCount,uint64_t *output,
                  int32_t outOffset)

{
  uint uVar1;
  uint32_t uVar2;
  long lVar3;
  uint64_t uVar4;
  uint uVar5;
  uint count;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar5 = inCount + inOffset;
  uVar10 = outOffset;
  if ((uint)inOffset < uVar5) {
    do {
      count = uVar5 - inOffset;
      uVar2 = tryRunLength(input,inOffset,count);
      if (uVar2 == 0) {
        lVar3 = 1;
        do {
          uVar1 = *(uint *)(Simple8b_Codec_bitLength + (uint)((0xf - (int)lVar3) * 4));
          if (count <= *(uint *)(Simple8b_Codec_bitLength + (uint)((0xf - (int)lVar3) * 4))) {
            uVar1 = count;
          }
          uVar4 = lVar3 << 0x3c;
          if (uVar1 == 0) {
            uVar7 = 0;
          }
          else {
            uVar11 = 0;
            uVar8 = 0;
            do {
              uVar7 = input[(uint)(inOffset + (int)uVar8)] >>
                      ((ulong)*(uint *)(Simple8b_Codec_bitLength + lVar3 * 4) & 0x3f);
              uVar6 = (ulong)input[(uint)(inOffset + (int)uVar8)] << (uVar11 & 0x3f);
              if (uVar7 != 0) {
                uVar6 = 0;
              }
              uVar4 = uVar6 | uVar4;
              uVar6 = uVar8;
              if (uVar7 != 0) break;
              uVar8 = uVar8 + 1;
              uVar11 = (ulong)((int)uVar11 + *(uint *)(Simple8b_Codec_bitLength + lVar3 * 4));
              uVar6 = (ulong)uVar1;
            } while (uVar1 != uVar8);
            uVar7 = (uint)uVar6;
          }
          uVar9 = 0;
          if (uVar7 == uVar1) {
            uVar9 = uVar1;
          }
          inOffset = inOffset + uVar9;
          if (uVar7 == uVar1) goto LAB_00129b6c;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0xf);
        lVar3 = 0xf;
        uVar4 = 0;
LAB_00129b6c:
        if ((int)lVar3 == 0xf) {
          uVar8 = (ulong)(uint)inOffset;
          inOffset = inOffset + 1;
          uVar4 = (ulong)input[uVar8] | 0xf000000000000000;
        }
      }
      else {
        if (0xffffffe < uVar2) {
          uVar2 = 0xfffffff;
        }
        uVar4 = CONCAT44(uVar2,input[(uint)inOffset]) | 0xf000000000000000;
        inOffset = uVar2 + inOffset;
      }
      uVar8 = (ulong)uVar10;
      uVar10 = uVar10 + 1;
      output[uVar8] = uVar4;
    } while ((uint)inOffset < uVar5);
  }
  return uVar10 - outOffset;
}

Assistant:

static int32_t Compress(const uint32_t *input, int32_t inOffset,
                          uint32_t inCount, uint64_t *output,
                          int32_t outOffset) {
    uint32_t inPos = inOffset;
    uint32_t inEnd = inOffset + inCount;
    uint32_t outPos = outOffset;

    while (inPos < inEnd) {
      uint32_t remainingCount = inEnd - inPos;
      uint64_t outVal = 0;

#if defined(_SIMPLE8B_USE_RLE)
      // try if run-length encoding packs better than bit packing
      uint64_t repeatCount = tryRunLength(input, inPos, remainingCount);
      if (repeatCount > 0) {
        repeatCount = (repeatCount < RLE_MAX_COUNT_MASK) ? repeatCount
                                                         : RLE_MAX_COUNT_MASK;
        outVal = (static_cast<uint64_t>(SIMPLE8B_MAXCODE) << SIMPLE8B_BITSIZE) |
                 (repeatCount << RLE_MAX_VALUE_BITS) | input[inPos];
        inPos += static_cast<uint32_t>(repeatCount);
      } else
#endif
      {
        // otherwise try all the bit packing possibilities
        uint32_t code = SIMPLE8B_MINCODE;
        for (; code < SIMPLE8B_MAXCODE; code++) {
          uint32_t intNum = Simple8b_Codec_bitLength[SIMPLE8B_MAXCODE - code];
          uint32_t bitLen = Simple8b_Codec_bitLength[code];
          intNum = (intNum < remainingCount) ? intNum : remainingCount;

          uint64_t maxVal = (1ULL << bitLen) - 1;
          uint64_t val = static_cast<uint64_t>(code) << SIMPLE8B_BITSIZE;
          uint32_t j = 0;
          for (; j < intNum; j++) {
            uint64_t inputVal = static_cast<uint64_t>(input[inPos + j]);
            if (inputVal > maxVal) {
              break;
            }
            val |= inputVal << (j * bitLen);
          }
          if (j == intNum) {
            outVal = val;
            inPos += intNum;
            break;
          }
        }
        // if no bit packing possible, encode just one value
        if (code == SIMPLE8B_MAXCODE) {
          outVal = (static_cast<uint64_t>(code) << SIMPLE8B_BITSIZE) |
                   input[inPos++];
        }
      }
      output[outPos++] = outVal;
    }
    return outPos - outOffset;
  }